

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall CheaterBotStrategy::cheaterAttack(CheaterBotStrategy *this)

{
  pointer ppCVar1;
  Country *toExchange;
  pointer ppPVar2;
  pointer pcVar3;
  bool bVar4;
  GameLoop *pGVar5;
  pointer ppPVar6;
  ostream *poVar7;
  PlayerState *pPVar8;
  int iVar9;
  pointer ppCVar10;
  Player *pPVar11;
  pointer ppCVar12;
  long *local_58;
  long local_50;
  long local_48 [2];
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "We have a cheater! They are conquering all their neighbouring countries",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pPVar11 = (this->super_PlayerStrategy).player;
  ppCVar12 = (pPVar11->pOwnedCountries->
             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (pPVar11->pOwnedCountries->
             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  iVar9 = 1;
  if (ppCVar12 != local_38) {
    do {
      ppCVar1 = ((*ppCVar12)->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar10 = ((*ppCVar12)->pAdjCountries->
                      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                      super__Vector_impl_data._M_start; ppCVar10 != ppCVar1; ppCVar10 = ppCVar10 + 1
          ) {
        toExchange = *ppCVar10;
        if (*toExchange->pPlayerOwnerId != *((this->super_PlayerStrategy).player)->pPlayerId) {
          pGVar5 = GameLoop::getInstance();
          ppPVar6 = (pGVar5->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          ppPVar2 = (pGVar5->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (ppPVar6 != ppPVar2) {
            pPVar11 = (Player *)0x0;
            do {
              if (*(*ppPVar6)->pPlayerId == *toExchange->pPlayerOwnerId) {
                pPVar11 = *ppPVar6;
              }
              ppPVar6 = ppPVar6 + 1;
            } while (ppPVar6 != ppPVar2);
            if ((pPVar11 != (Player *)0x0) &&
               (bVar4 = exchangeCountryOwnership(this,pPVar11,toExchange), bVar4)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"[CHEATER] - Country ",0x14);
              local_58 = local_48;
              pcVar3 = (toExchange->cyName->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,pcVar3,pcVar3 + toExchange->cyName->_M_string_length);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_58,local_50);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," has been attacked & conquered by Player ",0x29);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 (poVar7,*((this->super_PlayerStrategy).player)->pPlayerId);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," -\n",3);
              if (local_58 != local_48) {
                operator_delete(local_58,local_48[0] + 1);
              }
              goto LAB_0010ad4b;
            }
          }
          pPVar11 = (this->super_PlayerStrategy).player;
          iVar9 = -1;
          goto LAB_0010ad77;
        }
LAB_0010ad4b:
      }
      ppCVar12 = ppCVar12 + 1;
    } while (ppCVar12 != local_38);
    pPVar11 = (this->super_PlayerStrategy).player;
    iVar9 = 1;
  }
LAB_0010ad77:
  operator_delete(pPVar11->currentState,4);
  pPVar8 = (PlayerState *)operator_new(4);
  *pPVar8 = IDLE;
  pPVar11->currentState = pPVar8;
  (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
  return iVar9;
}

Assistant:

int CheaterBotStrategy::cheaterAttack() {
    std::cout << "We have a cheater! They are conquering all their neighbouring countries" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() == this->player->getPlayerId()) {
                continue;
            }
            Player* defendingPlayer = nullptr;
            for (auto* i : *GameLoop::getInstance()->getAllPlayers()) {
                if (i->getPlayerId() == neighbour->getPlayerOwnerID()) {
                    defendingPlayer = i;
                }
            }
            if (defendingPlayer == nullptr) {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
            if (exchangeCountryOwnership(defendingPlayer, neighbour)) {
                std::cout << "[CHEATER] - Country " << neighbour->getCountryName() << " has been attacked & conquered by Player " << this->player->getPlayerId() << " -\n";
                continue;
            } else {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}